

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O2

Unique<Polyline<2L>_> __thiscall
anurbs::Polyline<2L>::load(Polyline<2L> *this,Model *model,Json *data)

{
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *this_00;
  const_reference pvVar1;
  size_type sVar2;
  size_type sVar3;
  Index i;
  long lVar4;
  value_type points;
  Matrix<double,_1,_2,_1,_1,_2> ret;
  allocator<char> local_59;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_58;
  key_type local_48;
  
  new_<anurbs::Polyline<2l>>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"points",&local_59);
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(data,&local_48);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_58,pvVar1);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             *)(this->m_points).
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(&local_58);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::resize(this_00,sVar2);
  lVar4 = 0;
  sVar2 = 0;
  while( true ) {
    sVar3 = nlohmann::
            basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::size(&local_58);
    if ((long)sVar3 <= (long)sVar2) break;
    pvVar1 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&local_58,sVar2);
    nlohmann::adl_serializer<Eigen::Matrix<double,1,2,1,1,2>,void>::
    from_json<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar1,(Vector<2> *)&local_48);
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::operator=
              ((Matrix<double,_1,_2,_1,_1,_2> *)
               (*(long *)&(((this->m_points).
                            super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage +
               lVar4),(Matrix<double,_1,_2,_1,_1,_2> *)&local_48);
    sVar2 = sVar2 + 1;
    lVar4 = lVar4 + 0x10;
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_58);
  return (__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Polyline<TDimension>> load(Model& model, const Json& data)
    {
        auto result = new_<Polyline<TDimension>>();

        // load Points
        {
            const auto points = data.at("points");

            result->m_points.resize(points.size());

            for (Index i = 0; i < length(points); i++) {
                result->m_points[i] = points[i];
            }
        }

        return result;
    }